

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

bool __thiscall
OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,FaceHandle _fh,bool _check_vertex)

{
  bool bVar1;
  value_type _eh;
  value_type _vh;
  Face *pFVar2;
  undefined1 local_48 [8];
  ConstFaceEdgeIter cfeit;
  
  pFVar2 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
  cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pFVar2->halfedge_handle_).super_BaseHandle.idx_;
  cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  local_48 = (undefined1  [8])this;
  cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       (int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
  if ((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
    do {
      if (((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      _eh = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                         *)local_48);
      bVar1 = is_boundary(this,(EdgeHandle)_eh.super_BaseHandle.idx_);
      if (bVar1) {
        return true;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                    *)local_48);
    } while (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  if (_check_vertex) {
    pFVar2 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
    cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
         (pFVar2->halfedge_handle_).super_BaseHandle.idx_;
    cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
         (BaseHandle)0x0;
    cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
         (BaseHandle)0xffffffff;
    if ((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
      local_48 = (undefined1  [8])this;
      cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
           (int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
      do {
        if (((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
             cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
           (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
            idx_ != 0)) {
          return false;
        }
        _vh = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                           *)local_48);
        bVar1 = is_boundary(this,(VertexHandle)_vh.super_BaseHandle.idx_);
        if (bVar1) {
          return true;
        }
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_48);
      } while (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_boundary(FaceHandle _fh, bool _check_vertex) const
{
  for (ConstFaceEdgeIter cfeit = cfe_iter( _fh ); cfeit.is_valid(); ++cfeit)
      if (is_boundary( *cfeit ) )
        return true;

  if (_check_vertex)
  {
      for (ConstFaceVertexIter cfvit = cfv_iter( _fh ); cfvit.is_valid(); ++cfvit)
        if (is_boundary( *cfvit ) )
            return true;
  }
  return false;
}